

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGStreamReaderWriter.cpp
# Opt level: O3

bool __thiscall VCGStreamReaderWriter::Fill(VCGStreamReaderWriter *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  pointer puVar2;
  element_type *peVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  string Error;
  error_code local_a0;
  system_error local_90;
  pointer local_50;
  ulong local_48;
  
  this_00 = &(this->super_VBuffer).m_BufferImpl.m_Buffer;
  if ((this->m_pMulticastSocket).
      super___shared_ptr<boost::asio::basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,8);
    (this->super_VBuffer).m_BufferImpl.m_Offset = 0;
    peVar3 = (this->m_pSocket).
             super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    puVar1 = (this->super_VBuffer).m_BufferImpl.m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->super_VBuffer).m_BufferImpl.m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_50 = (pointer)0x0;
    if (puVar1 != puVar2) {
      local_50 = puVar1;
    }
    local_48 = (ulong)(uint)((int)puVar2 - (int)puVar1);
    boost::system::error_code::error_code(&local_a0);
    local_90._0_8_ = &local_50;
    boost::asio::detail::
    read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t>
              (peVar3,&local_50);
    if (local_a0.failed_ == true) {
      std::runtime_error::runtime_error(&local_90.super_runtime_error,"read");
      local_90.m_what._M_dataplus._M_p = (pointer)&local_90.m_what.field_2;
      local_90._0_8_ = &PTR__system_error_0019e838;
      local_90.m_error_code.cat_ = local_a0.cat_;
      local_90.m_what._M_string_length = 0;
      local_90.m_what.field_2._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>(&local_90);
    }
    (this->super_VBuffer).m_BufferImpl.m_Offset = 4;
    puVar1 = (this->super_VBuffer).m_BufferImpl.m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->super_VBuffer).m_BufferImpl.m_Buffer.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1;
    uVar5 = 0;
    if (7 < uVar7) {
      uVar5 = *(uint *)(puVar1 + 4);
      (this->super_VBuffer).m_BufferImpl.m_Offset = 8;
    }
    uVar6 = (int)uVar7 + uVar5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(ulong)uVar6);
    uVar4 = (this->super_VBuffer).m_BufferImpl.m_Offset;
    if (uVar4 < uVar6) {
      uVar6 = uVar4;
    }
    (this->super_VBuffer).m_BufferImpl.m_Offset = uVar6;
    peVar3 = (this->m_pSocket).
             super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    puVar1 = (this->super_VBuffer).m_BufferImpl.m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = (pointer)0x0;
    if (puVar1 != (this->super_VBuffer).m_BufferImpl.m_Buffer.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      local_50 = puVar1;
    }
    local_50 = local_50 + 8;
    local_48 = (ulong)uVar5;
    boost::system::error_code::error_code(&local_a0);
    local_90._0_8_ = &local_50;
    boost::asio::detail::
    read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t>
              (peVar3,&local_50,&local_90,&local_a0);
    if (local_a0.failed_ == true) {
      std::runtime_error::runtime_error(&local_90.super_runtime_error,"read");
      local_90.m_what._M_dataplus._M_p = (pointer)&local_90.m_what.field_2;
      local_90._0_8_ = &PTR__system_error_0019e838;
      local_90.m_error_code.cat_ = local_a0.cat_;
      local_90.m_what._M_string_length = 0;
      local_90.m_what.field_2._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>(&local_90);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x10000);
    uVar5 = (this->super_VBuffer).m_BufferImpl.m_Offset;
    uVar4 = 0x10000;
    if (uVar5 < 0x10000) {
      uVar4 = uVar5;
    }
    (this->super_VBuffer).m_BufferImpl.m_Offset = uVar4;
    puVar1 = (this->super_VBuffer).m_BufferImpl.m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->super_VBuffer).m_BufferImpl.m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_90._0_8_ = (pointer)0x0;
    if (puVar1 != puVar2) {
      local_90._0_8_ = puVar1;
    }
    local_90._8_8_ = ZEXT48((uint)((int)puVar2 - (int)puVar1));
    boost::asio::
    basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::receive<boost::asio::mutable_buffers_1>
              ((this->m_pMulticastSocket).
               super___shared_ptr<boost::asio::basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(mutable_buffers_1 *)&local_90);
  }
  (this->super_VBuffer).m_BufferImpl.m_Offset = 0;
  return true;
}

Assistant:

bool VCGStreamReaderWriter::Fill()
{
  try
  {
    if( m_pMulticastSocket )
    {
      SetLength( 64 * 1024 );
      m_pMulticastSocket->receive( boost::asio::buffer( Raw(), Length() ) );
      SetOffset( 0 );
    }
    else
    {
      const unsigned int HeaderSize = sizeof( ViconCGStreamType::Enum ) + sizeof( ViconCGStreamType::UInt32 );
      SetLength( HeaderSize );
      SetOffset( 0 );
      boost::asio::read( *m_pSocket, boost::asio::buffer( Raw(), Length() ) );
      
      SetOffset( sizeof( ViconCGStreamType::Enum ) );
      ViconCGStreamType::UInt32 BlockLength = 0;
      Read( BlockLength );
      
      SetLength( Length() + BlockLength );
      boost::asio::read( *m_pSocket, boost::asio::buffer( Raw() + HeaderSize, BlockLength ) );
      SetOffset( 0 );
    }

  } 
  catch( boost::system::system_error & rError )
  {
    std::string Error = rError.what();
    return false;
  }
  
  return true;
}